

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt_enum(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                         NameValue *nvlist,long lval)

{
  NameValue *local_48;
  NameValue *nv;
  _Bool skip;
  CURLcode ret;
  long lval_local;
  NameValue *nvlist_local;
  CURLoption tag_local;
  char *name_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  nv._4_4_ = curl_easy_setopt(curl,tag,lval);
  if (((config->libcurl != (char *)0x0) && (lval != 0)) && (local_48 = nvlist, nv._4_4_ == CURLE_OK)
     ) {
    for (; (local_48->name != (char *)0x0 && (local_48->value != lval)); local_48 = local_48 + 1) {
    }
    if (local_48->name == (char *)0x0) {
      nv._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, %ldL);",name,lval);
    }
    else {
      nv._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, (long)%s);",name,
                              local_48->name);
    }
  }
  return nv._4_4_;
}

Assistant:

CURLcode tool_setopt_enum(CURL *curl, struct GlobalConfig *config,
                          const char *name, CURLoption tag,
                          const NameValue *nvlist, long lval)
{
  CURLcode ret = CURLE_OK;
  bool skip = FALSE;

  ret = curl_easy_setopt(curl, tag, lval);
  if(!lval)
    skip = TRUE;

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */
    const NameValue *nv = NULL;
    for(nv = nvlist; nv->name; nv++) {
      if(nv->value == lval) break; /* found it */
    }
    if(! nv->name) {
      /* If no definition was found, output an explicit value.
       * This could happen if new values are defined and used
       * but the NameValue list is not updated. */
      CODE2("curl_easy_setopt(hnd, %s, %ldL);", name, lval);
    }
    else {
      CODE2("curl_easy_setopt(hnd, %s, (long)%s);", name, nv->name);
    }
  }

 nomem:
  return ret;
}